

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::insert
          (CImgList<unsigned_char> *this,CImg<unsigned_char> *img,uint pos,bool is_shared)

{
  CImg<unsigned_char> *pCVar1;
  undefined8 *puVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  CImg<unsigned_char> *pCVar8;
  CImgArgumentException *this_00;
  long lVar9;
  ulong uVar10;
  CImg<unsigned_char> *pCVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar12 = this->_width;
  if (pos == 0xffffffff) {
    pos = uVar12;
  }
  uVar13 = (ulong)pos;
  if (uVar12 < pos) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char",
               (ulong)img->_width,(ulong)img->_height,(ulong)img->_depth,(ulong)img->_spectrum,
               img->_data,uVar13);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  this->_width = uVar12 + 1;
  uVar3 = this->_allocated_width;
  if (uVar3 < uVar12 + 1) {
    uVar10 = 0x10;
    if (uVar3 != 0) {
      uVar10 = (ulong)(uVar3 * 2);
    }
    this->_allocated_width = (uint)uVar10;
    puVar7 = (ulong *)operator_new__(uVar10 * 0x20 + 8);
    *puVar7 = uVar10;
    if ((uint)uVar10 != 0) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)puVar7 + lVar9 + 0x20) = 0;
        puVar2 = (undefined8 *)((long)puVar7 + lVar9 + 8);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined1 *)((long)puVar7 + lVar9 + 0x18) = 0;
        lVar9 = lVar9 + 0x20;
      } while (uVar10 * 0x20 != lVar9);
    }
    pCVar11 = (CImg<unsigned_char> *)(puVar7 + 1);
    pCVar8 = this->_data;
    if (pCVar8 != (CImg<unsigned_char> *)0x0) {
      if (pos != 0) {
        memcpy(pCVar11,pCVar8,uVar13 << 5);
      }
      if (uVar12 - pos != 0) {
        memcpy(pCVar11 + (ulong)pos + 1,pCVar8 + pos,(ulong)(uVar12 - pos) << 5);
      }
      if ((is_shared) && (puVar4 = img->_data, puVar4 != (uchar *)0x0)) {
        uVar13 = (ulong)pos;
        uVar3 = img->_height;
        uVar5 = img->_depth;
        uVar6 = img->_spectrum;
        pCVar1 = pCVar11 + uVar13;
        pCVar1->_width = img->_width;
        pCVar1->_height = uVar3;
        pCVar1->_depth = uVar5;
        pCVar1->_spectrum = uVar6;
        *(undefined1 *)(puVar7 + uVar13 * 4 + 3) = 1;
        puVar7[uVar13 * 4 + 4] = (ulong)puVar4;
      }
      else {
        uVar13 = (ulong)pos;
        puVar7[uVar13 * 4 + 4] = 0;
        pCVar8 = pCVar11 + uVar13;
        pCVar8->_width = 0;
        pCVar8->_height = 0;
        pCVar8->_depth = 0;
        pCVar8->_spectrum = 0;
        CImg<unsigned_char>::assign<unsigned_char>(pCVar11 + uVar13,img);
        pCVar8 = this->_data;
        uVar12 = this->_width - 1;
      }
      memset(pCVar8,0,(ulong)uVar12 << 5);
      pCVar8 = this->_data;
      if (pCVar8 != (CImg<unsigned_char> *)0x0) {
        if (pCVar8[-1]._data != (uchar *)0x0) {
          lVar9 = (long)pCVar8[-1]._data << 5;
          do {
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)((long)&pCVar8[-1]._width + lVar9));
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != 0);
        }
        operator_delete__(&pCVar8[-1]._data);
      }
      this->_data = pCVar11;
      return this;
    }
  }
  else {
    pCVar11 = this->_data;
    if (pCVar11 != (CImg<unsigned_char> *)0x0) {
      if (uVar12 - pos != 0) {
        memmove(pCVar11 + uVar13 + 1,pCVar11 + uVar13,(ulong)(uVar12 - pos) << 5);
      }
      if (is_shared) {
        puVar4 = img->_data;
        pCVar8 = this->_data;
        if (puVar4 != (uchar *)0x0) {
          uVar12 = img->_height;
          uVar3 = img->_depth;
          uVar5 = img->_spectrum;
          pCVar11 = pCVar8 + uVar13;
          pCVar11->_width = img->_width;
          pCVar11->_height = uVar12;
          pCVar11->_depth = uVar3;
          pCVar11->_spectrum = uVar5;
          pCVar8[uVar13]._is_shared = true;
          pCVar8[uVar13]._data = puVar4;
          return this;
        }
      }
      else {
        pCVar8 = this->_data;
      }
      pCVar8[uVar13]._data = (uchar *)0x0;
      pCVar11 = pCVar8 + uVar13;
      pCVar8 = pCVar8 + uVar13;
      pCVar8->_width = 0;
      pCVar8->_height = 0;
      pCVar8->_depth = 0;
      pCVar8->_spectrum = 0;
      goto LAB_00112040;
    }
    pCVar11 = (CImg<unsigned_char> *)0x0;
  }
  this->_data = pCVar11;
  if ((is_shared) && (puVar4 = img->_data, puVar4 != (uchar *)0x0)) {
    uVar12 = img->_height;
    uVar3 = img->_depth;
    uVar5 = img->_spectrum;
    pCVar11->_width = img->_width;
    pCVar11->_height = uVar12;
    pCVar11->_depth = uVar3;
    pCVar11->_spectrum = uVar5;
    pCVar11->_is_shared = true;
    pCVar11->_data = puVar4;
    return this;
  }
LAB_00112040:
  CImg<unsigned_char>::assign<unsigned_char>(pCVar11,img);
  return this;
}

Assistant:

CImgList<T>& insert(const CImg<T>& img, const unsigned int pos=~0U, const bool is_shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if (npos>_width)
        throw CImgArgumentException(_cimglist_instance
                                    "insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u.",
                                    cimglist_instance,
                                    img._width,img._height,img._depth,img._spectrum,img._data,npos);
      CImg<T> *const new_data = (++_width>_allocated_width)?new CImg<T>[_allocated_width?(_allocated_width<<=1):(_allocated_width=16)]:0;
      if (!_data) { // Insert new element into empty list.
        _data = new_data;
        if (is_shared && img) {
          _data->_width = img._width; _data->_height = img._height; _data->_depth = img._depth; _data->_spectrum = img._spectrum;
          _data->_is_shared = true; _data->_data = img._data;
        } else *_data = img;
      }
      else {
        if (new_data) { // Insert with re-allocation.
          if (npos) std::memcpy(new_data,_data,sizeof(CImg<T>)*npos);
          if (npos!=_width-1) std::memcpy(new_data+npos+1,_data+npos,sizeof(CImg<T>)*(_width-1-npos));
          if (is_shared && img) {
            new_data[npos]._width = img._width; new_data[npos]._height = img._height; new_data[npos]._depth = img._depth;
            new_data[npos]._spectrum = img._spectrum; new_data[npos]._is_shared = true; new_data[npos]._data = img._data;
          } else {
            new_data[npos]._width = new_data[npos]._height = new_data[npos]._depth = new_data[npos]._spectrum = 0; new_data[npos]._data = 0;
            new_data[npos] = img;
          }
          std::memset(_data,0,sizeof(CImg<T>)*(_width-1));
          delete[] _data;
          _data = new_data;
        } else { // Insert without re-allocation.
          if (npos!=_width-1) std::memmove(_data+npos+1,_data+npos,sizeof(CImg<T>)*(_width-1-npos));
          if (is_shared && img) {
            _data[npos]._width = img._width; _data[npos]._height = img._height; _data[npos]._depth = img._depth; _data[npos]._spectrum = img._spectrum;
            _data[npos]._is_shared = true; _data[npos]._data = img._data;
          } else {
            _data[npos]._width = _data[npos]._height = _data[npos]._depth = _data[npos]._spectrum = 0; _data[npos]._data = 0;
            _data[npos] = img;
          }
        }
      }
      return *this;
    }